

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverseType
          (Node *this,Reader *type,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  Which WVar1;
  Reader local_280;
  Reader local_250;
  Reader local_220;
  Reader local_1f0;
  Reader local_1c0;
  Reader local_190;
  Reader local_160;
  Reader local_130;
  Reader local_100;
  Reader local_d0;
  Reader local_a0;
  undefined1 local_70 [8];
  Reader brand;
  uint64_t id;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  uint eagerness_local;
  Reader *type_local;
  Node *this_local;
  
  brand._reader.nestingLimit = 0;
  brand._reader._44_4_ = 0;
  capnp::schema::Brand::Reader::Reader((Reader *)local_70);
  WVar1 = capnp::schema::Type::Reader::which(type);
  switch(WVar1) {
  case LIST:
    capnp::schema::Type::Reader::getList(&local_280,type);
    capnp::schema::Type::List::Reader::getElementType(&local_250,&local_280);
    traverseType(this,&local_250,eagerness,seen,finalLoader,sourceInfo);
    return;
  case ENUM:
    capnp::schema::Type::Reader::getEnum(&local_130,type);
    brand._reader._40_8_ = capnp::schema::Type::Enum::Reader::getTypeId(&local_130);
    capnp::schema::Type::Reader::getEnum(&local_190,type);
    capnp::schema::Type::Enum::Reader::getBrand(&local_160,&local_190);
    memcpy(local_70,&local_160,0x30);
    break;
  case STRUCT:
    capnp::schema::Type::Reader::getStruct(&local_a0,type);
    brand._reader._40_8_ = capnp::schema::Type::Struct::Reader::getTypeId(&local_a0);
    capnp::schema::Type::Reader::getStruct(&local_100,type);
    capnp::schema::Type::Struct::Reader::getBrand(&local_d0,&local_100);
    memcpy(local_70,&local_d0,0x30);
    break;
  case INTERFACE:
    capnp::schema::Type::Reader::getInterface(&local_1c0,type);
    brand._reader._40_8_ = capnp::schema::Type::Interface::Reader::getTypeId(&local_1c0);
    capnp::schema::Type::Reader::getInterface(&local_220,type);
    capnp::schema::Type::Interface::Reader::getBrand(&local_1f0,&local_220);
    memcpy(local_70,&local_1f0,0x30);
    break;
  default:
    goto switchD_003caa34_default;
  }
  traverseDependency(this,brand._reader._40_8_,eagerness,seen,finalLoader,sourceInfo,false);
  traverseBrand(this,(Reader *)local_70,eagerness,seen,finalLoader,sourceInfo);
switchD_003caa34_default:
  return;
}

Assistant:

void Compiler::Node::traverseType(const schema::Type::Reader& type, uint eagerness,
                                  std::unordered_map<Node*, uint>& seen,
                                  const SchemaLoader& finalLoader,
                                  kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint64_t id = 0;
  schema::Brand::Reader brand;
  switch (type.which()) {
    case schema::Type::STRUCT:
      id = type.getStruct().getTypeId();
      brand = type.getStruct().getBrand();
      break;
    case schema::Type::ENUM:
      id = type.getEnum().getTypeId();
      brand = type.getEnum().getBrand();
      break;
    case schema::Type::INTERFACE:
      id = type.getInterface().getTypeId();
      brand = type.getInterface().getBrand();
      break;
    case schema::Type::LIST:
      traverseType(type.getList().getElementType(), eagerness, seen, finalLoader, sourceInfo);
      return;
    default:
      return;
  }

  traverseDependency(id, eagerness, seen, finalLoader, sourceInfo);
  traverseBrand(brand, eagerness, seen, finalLoader, sourceInfo);
}